

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_block.cpp
# Opt level: O0

void __thiscall cfdcapi_block_GetBlockData_Test::TestBody(cfdcapi_block_GetBlockData_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  char *str_buffer;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  char *temp_txid;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  uint32_t tx_count;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  char *proof;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  char *tx;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  uint32_t time_data;
  uint32_t bits;
  uint32_t nonce;
  uint32_t version;
  char *merkle_hash;
  char *prev_hash;
  char *txid;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *block_hash;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *block_handle;
  char *block_hex;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined4 *puVar5;
  void **in_stack_fffffffffffff920;
  void **in_stack_fffffffffffff928;
  char *in_stack_fffffffffffff930;
  AssertionResult *pAVar6;
  undefined7 in_stack_fffffffffffff938;
  undefined1 in_stack_fffffffffffff93f;
  void *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  char *in_stack_fffffffffffff9b8;
  char *in_stack_fffffffffffff9d0;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  char *in_stack_fffffffffffffa60;
  char **in_stack_fffffffffffffa90;
  char **in_stack_fffffffffffffa98;
  AssertionResult *pAVar7;
  uint32_t index;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  char *in_stack_fffffffffffffaa8;
  void **in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  char *in_stack_fffffffffffffac0;
  AssertionResult *in_stack_fffffffffffffac8;
  uint32_t *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  char **in_stack_fffffffffffffb20;
  AssertionResult *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  char *in_stack_fffffffffffffb38;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffb48;
  uint32_t *in_stack_fffffffffffffb50;
  AssertionResult *this_01;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffb80;
  AssertHelper local_468;
  Message local_460;
  undefined4 local_454;
  AssertionResult local_450;
  AssertHelper local_440;
  Message local_438;
  AssertionResult local_430;
  AssertHelper local_420;
  Message local_418;
  undefined4 local_40c;
  AssertionResult local_408;
  char *local_3f8;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  AssertionResult local_3b8;
  AssertHelper local_3a8;
  Message local_3a0;
  undefined4 local_394;
  AssertionResult local_390;
  char *local_380;
  AssertHelper local_378;
  Message local_370;
  undefined4 local_364;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_33c;
  AssertionResult local_338;
  undefined4 local_324;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  char *local_288;
  AssertHelper local_280;
  Message local_278;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_24c;
  AssertionResult local_248;
  char *local_238;
  AssertHelper local_230;
  Message local_228;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined4 local_1b4;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  char *local_118;
  char *local_110;
  char *local_108;
  AssertHelper local_100;
  Message local_f8;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  char *local_b8;
  AssertHelper local_b0;
  Message local_a8;
  undefined8 local_a0;
  AssertionResult local_98;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_74;
  AssertionResult local_70;
  undefined8 local_60;
  char *local_58;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = CfdCreateSimpleHandle
                       ((void **)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938));
  local_2c = 0;
  pAVar6 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
             in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
             (int *)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffffb80 =
         testing::AssertionResult::failure_message((AssertionResult *)0x30e0ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x15,in_stack_fffffffffffffb80);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x30e14d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30e1a5);
  local_58 = 
  "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f200000000001020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000"
  ;
  local_60 = 0;
  local_14 = CfdInitializeBlockHandle
                       (in_stack_fffffffffffffac8,(int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                        (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                        in_stack_fffffffffffffab0);
  local_74 = 0;
  this_02 = &local_70;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
             in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
             (int *)in_stack_fffffffffffff920);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30e293);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x1b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message((Message *)0x30e2f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30e34b);
  local_a0 = 0;
  this_01 = &local_98;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
             in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    in_stack_fffffffffffffb50 =
         (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x30e3f9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x1c,(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message((Message *)0x30e45c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30e4b4);
  if (local_14 == 0) {
    local_b8 = (char *)0x0;
    local_14 = CfdGetBlockHash(in_stack_fffffffffffffaa8,
                               (void *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0)
                               ,in_stack_fffffffffffffa98);
    index = (uint32_t)((ulong)in_stack_fffffffffffffa98 >> 0x20);
    local_cc = 0;
    this_00 = &local_c8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_d8);
      in_stack_fffffffffffffb38 =
           testing::AssertionResult::failure_message((AssertionResult *)0x30e59f);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x20,in_stack_fffffffffffffb38);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::Message::~Message((Message *)0x30e602);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30e657);
    if (local_14 == 0) {
      in_stack_fffffffffffffb28 = &local_f0;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffb28,
                 "\"53fd7b794cf751a148b2be637df6c7daf663f1be509cb35294bd69400fdc694e\"","block_hash"
                 ,"53fd7b794cf751a148b2be637df6c7daf663f1be509cb35294bd69400fdc694e",local_b8);
      in_stack_fffffffffffffb37 =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffb28);
      if (!(bool)in_stack_fffffffffffffb37) {
        testing::Message::Message(&local_f8);
        in_stack_fffffffffffffb20 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x30e706);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x24,(char *)in_stack_fffffffffffffb20);
        testing::internal::AssertHelper::operator=(&local_100,&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        testing::Message::~Message((Message *)0x30e769);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30e7be);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    }
    local_108 = "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe";
    local_110 = (char *)0x0;
    local_118 = (char *)0x0;
    local_11c = 0;
    local_120 = 0;
    local_124 = 0;
    local_128 = 0;
    in_stack_fffffffffffff920 = (void **)&local_120;
    puVar5 = &local_124;
    local_14 = CfdGetBlockHeaderData
                         (in_stack_fffffffffffffb38,
                          (void *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                          (uint32_t *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                          (char **)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                          in_stack_fffffffffffffb10,in_stack_fffffffffffffb50,(uint32_t *)this_01);
    local_13c = 0;
    pAVar7 = &local_138;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30e923);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x31,pcVar4);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x30e986);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30e9de);
    if (local_14 == 0) {
      local_164 = 0x30000000;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
                 in_stack_fffffffffffff930,(int *)in_stack_fffffffffffff928,
                 (uint *)in_stack_fffffffffffff920);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30ea99);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x33,pcVar4);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message((Message *)0x30eafc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30eb51);
      local_18c = 0x60264e41;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
                 in_stack_fffffffffffff930,(int *)in_stack_fffffffffffff928,
                 (uint *)in_stack_fffffffffffff920);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
      if (!bVar1) {
        testing::Message::Message(&local_198);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30ebfe);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x34,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        testing::Message::~Message((Message *)0x30ec61);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30ecb6);
      local_1b4 = 0x207fffff;
      in_stack_fffffffffffffac8 = &local_1b0;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
                 in_stack_fffffffffffff930,(int *)in_stack_fffffffffffff928,
                 (uint *)in_stack_fffffffffffff920);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffac8);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        in_stack_fffffffffffffac0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x30ed63);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x35,in_stack_fffffffffffffac0);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        testing::Message::~Message((Message *)0x30edc6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30ee1b);
      local_1dc = 0;
      pAVar7 = &local_1d8;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
                 in_stack_fffffffffffff930,(int *)in_stack_fffffffffffff928,
                 (uint *)in_stack_fffffffffffff920,puVar5);
      in_stack_fffffffffffffabf = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      if (!(bool)in_stack_fffffffffffffabf) {
        testing::Message::Message(&local_1e8);
        in_stack_fffffffffffffaa8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x30eecd);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x36,in_stack_fffffffffffffaa8);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        testing::Message::~Message((Message *)0x30ef30);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30ef85);
      pAVar7 = &local_200;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar7,
                 "\"2dae5f1ec784d5812cd1f56dd57f6bed8a5c004a0ded66164d81ad9b94587995\"","prev_hash",
                 "2dae5f1ec784d5812cd1f56dd57f6bed8a5c004a0ded66164d81ad9b94587995",local_110);
      in_stack_fffffffffffffaa7 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      index = (uint32_t)((ulong)pAVar7 >> 0x20);
      if (!(bool)in_stack_fffffffffffffaa7) {
        testing::Message::Message(&local_208);
        in_stack_fffffffffffffa90 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x30f026);
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x39,(char *)in_stack_fffffffffffffa90);
        testing::internal::AssertHelper::operator=(&local_210,&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        testing::Message::~Message((Message *)0x30f089);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30f0de);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_220,
                 "\"c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe\"",
                 "merkle_hash","c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",
                 local_118);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30f17f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x3c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        testing::Message::~Message((Message *)0x30f1e2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30f237);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    }
    local_238 = (char *)0x0;
    local_14 = CfdGetTransactionFromBlock
                         (pAVar6,in_stack_fffffffffffffb80,
                          (char *)CONCAT17(uVar2,in_stack_fffffffffffffb78),(char **)this_02);
    local_24c = 0;
    pAVar6 = &local_248;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      in_stack_fffffffffffffa60 =
           testing::AssertionResult::failure_message((AssertionResult *)0x30f338);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x43,in_stack_fffffffffffffa60);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message((Message *)0x30f39b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30f3f0);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_270,
                 "\"020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000\""
                 ,"tx",
                 "020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000"
                 ,local_238);
      in_stack_fffffffffffffa5f = testing::AssertionResult::operator_cast_to_bool(&local_270);
      if (!(bool)in_stack_fffffffffffffa5f) {
        testing::Message::Message(&local_278);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30f49f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_280,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x47,pcVar4);
        testing::internal::AssertHelper::operator=(&local_280,&local_278);
        testing::internal::AssertHelper::~AssertHelper(&local_280);
        testing::Message::~Message((Message *)0x30f502);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30f557);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    }
    local_288 = (char *)0x0;
    local_14 = CfdGetTxOutProof(this_01,in_stack_fffffffffffffb50,
                                (char *)CONCAT17(uVar3,in_stack_fffffffffffffb48),(char **)this_00);
    local_29c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30f64b);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x4d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message((Message *)0x30f6ae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30f703);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2c0,
                 "\"00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f20000000000100000001fe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec50101\""
                 ,"proof",
                 "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f20000000000100000001fe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec50101"
                 ,local_288);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30f7b2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x51,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        testing::Message::~Message((Message *)0x30f815);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30f86a);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    }
    local_14 = CfdExistTxidInBlock(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                                   (char *)CONCAT17(in_stack_fffffffffffffabf,
                                                    in_stack_fffffffffffffab8));
    local_2e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30f94a);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x56,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x30f9ad);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30fa05);
    local_14 = CfdExistTxidInBlock(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                                   (char *)CONCAT17(in_stack_fffffffffffffabf,
                                                    in_stack_fffffffffffffab8));
    local_30c = 8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30fad5);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x5a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message((Message *)0x30fb38);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30fb90);
    local_324 = 0;
    local_14 = CfdGetTxCountInBlock
                         (pAVar6,in_stack_fffffffffffffa60,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58))
    ;
    local_33c = 0;
    pAVar6 = &local_338;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      in_stack_fffffffffffff9d0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x30fc6c);
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x5e,in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(&local_350,&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      testing::Message::~Message((Message *)0x30fccf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30fd24);
    local_364 = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(int *)in_stack_fffffffffffff928,
               (uint *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message(&local_370);
      in_stack_fffffffffffff9b8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x30fdd1);
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x5f,in_stack_fffffffffffff9b8);
      testing::internal::AssertHelper::operator=(&local_378,&local_370);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      testing::Message::~Message((Message *)0x30fe34);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30fe8c);
    local_380 = (char *)0x0;
    local_14 = CfdGetTxidFromBlock(in_stack_fffffffffffffaa8,
                                   (void *)CONCAT17(in_stack_fffffffffffffaa7,
                                                    in_stack_fffffffffffffaa0),index,
                                   in_stack_fffffffffffffa90);
    local_394 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    in_stack_fffffffffffff9b7 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!(bool)in_stack_fffffffffffff9b7) {
      testing::Message::Message(&local_3a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30ff6b);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,99,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      testing::Message::~Message((Message *)0x30ffce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x310023);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3b8,"txid","temp_txid",local_108,local_380);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3100cd);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x65,pcVar4);
        testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper(&local_3c8);
        testing::Message::~Message((Message *)0x31012a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x31017f);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    }
    local_14 = CfdFreeBlockHandle(pAVar6,in_stack_fffffffffffff9d0);
    local_3dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
    if (!bVar1) {
      testing::Message::Message(&local_3e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31024b);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x6a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
      testing::internal::AssertHelper::~AssertHelper(&local_3f0);
      testing::Message::~Message((Message *)0x3102a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3102fd);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffff958);
  if (local_14 != 0) {
    local_3f8 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffff9b8,
                          (char **)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    local_40c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),
               in_stack_fffffffffffff930,(CfdErrorCode *)in_stack_fffffffffffff928,
               (int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3103ea);
      testing::internal::AssertHelper::AssertHelper
                (&local_420,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x71,pcVar4);
      testing::internal::AssertHelper::operator=(&local_420,&local_418);
      testing::internal::AssertHelper::~AssertHelper(&local_420);
      testing::Message::~Message((Message *)0x310447);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x31049c);
    testing::internal::CmpHelperSTREQ((internal *)&local_430,"\"\"","str_buffer","",local_3f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
    if (!bVar1) {
      testing::Message::Message(&local_438);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x310531);
      testing::internal::AssertHelper::AssertHelper
                (&local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x72,pcVar4);
      testing::internal::AssertHelper::operator=(&local_440,&local_438);
      testing::internal::AssertHelper::~AssertHelper(&local_440);
      testing::Message::~Message((Message *)0x31058e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3105e3);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    local_3f8 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff928);
  local_454 = 0;
  pAVar6 = &local_450;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938),&pAVar6->success_
             ,(CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3106b3);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message((Message *)0x310710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x310765);
  return;
}

Assistant:

TEST(cfdcapi_block, GetBlockData) {
  void* handle = nullptr;
  int ret = CfdCreateSimpleHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);

  const char* block_hex = "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f200000000001020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000";
  void* block_handle = nullptr;
  ret = CfdInitializeBlockHandle(
    handle, kCfdNetworkMainnet, block_hex, &block_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, block_handle);
  if (ret == kCfdSuccess) {
    char* block_hash = nullptr;
    ret = CfdGetBlockHash(handle, block_handle, &block_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "53fd7b794cf751a148b2be637df6c7daf663f1be509cb35294bd69400fdc694e",
        block_hash);
      CfdFreeStringBuffer(block_hash);
    }
    const char* txid = "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe";

    char* prev_hash = nullptr;
    char* merkle_hash = nullptr;
    uint32_t version = 0;
    uint32_t nonce = 0;
    uint32_t bits = 0;
    uint32_t time_data = 0;
    ret = CfdGetBlockHeaderData(handle, block_handle, &version, &prev_hash,
        &merkle_hash, &time_data, &bits, &nonce);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(805306368, version);
      EXPECT_EQ(1613123137, time_data);
      EXPECT_EQ(0x207fffff, bits);
      EXPECT_EQ(0, nonce);
      EXPECT_STREQ(
        "2dae5f1ec784d5812cd1f56dd57f6bed8a5c004a0ded66164d81ad9b94587995",
        prev_hash);
      EXPECT_STREQ(
        "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",
        merkle_hash);
      CfdFreeStringBuffer(prev_hash);
      CfdFreeStringBuffer(merkle_hash);
    }

    char* tx = nullptr;
    ret = CfdGetTransactionFromBlock(handle, block_handle, txid, &tx);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000",
        tx);
      CfdFreeStringBuffer(tx);
    }

    char* proof = nullptr;
    ret = CfdGetTxOutProof(handle, block_handle, txid, &proof);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f20000000000100000001fe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec50101",
        proof);
      CfdFreeStringBuffer(proof);
    }

    ret = CfdExistTxidInBlock(handle, block_handle, txid);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdExistTxidInBlock(handle, block_handle,
        "7f5fb624f5cdce391362aa6befea307c4e778e008e799b40ca7119046f26ab31");
    EXPECT_EQ(kCfdNotFoundError, ret);

    uint32_t tx_count = 0;
    ret = CfdGetTxCountInBlock(handle, block_handle, &tx_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, tx_count);

    char* temp_txid = nullptr;
    ret = CfdGetTxidFromBlock(handle, block_handle, 0, &temp_txid);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(txid, temp_txid);
      CfdFreeStringBuffer(temp_txid);
    }

    ret = CfdFreeBlockHandle(handle, block_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}